

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

void Fra_ClausSimInfoRecord(Clu_Man_t *p,int *pModel)

{
  int iVar1;
  uint *puVar2;
  int local_1c;
  int i;
  int *pModel_local;
  Clu_Man_t *p_local;
  
  if (p->nCexes == p->nCexesAlloc) {
    Fra_ClausSimInfoRealloc(p);
  }
  if (p->nCexes < p->nCexesAlloc) {
    local_1c = 0;
    do {
      if (p->pCnf->nVars <= local_1c) {
        p->nCexes = p->nCexes + 1;
        return;
      }
      if (pModel[local_1c] == 1) {
        puVar2 = (uint *)Vec_PtrEntry(p->vCexes,local_1c);
        iVar1 = Abc_InfoHasBit(puVar2,p->nCexes);
        if (iVar1 != 0) {
          __assert_fail("Abc_InfoHasBit( (unsigned *)Vec_PtrEntry(p->vCexes, i), p->nCexes ) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                        ,0x40e,"void Fra_ClausSimInfoRecord(Clu_Man_t *, int *)");
        }
        puVar2 = (uint *)Vec_PtrEntry(p->vCexes,local_1c);
        Abc_InfoSetBit(puVar2,p->nCexes);
      }
      local_1c = local_1c + 1;
    } while( true );
  }
  __assert_fail("p->nCexes < p->nCexesAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                ,0x409,"void Fra_ClausSimInfoRecord(Clu_Man_t *, int *)");
}

Assistant:

void Fra_ClausSimInfoRecord( Clu_Man_t * p, int * pModel )
{
    int i;
    if ( p->nCexes == p->nCexesAlloc )
        Fra_ClausSimInfoRealloc( p );
    assert( p->nCexes < p->nCexesAlloc );
    for ( i = 0; i < p->pCnf->nVars; i++ )
    {
        if ( pModel[i] == l_True )
        {
            assert( Abc_InfoHasBit( (unsigned *)Vec_PtrEntry(p->vCexes, i), p->nCexes ) == 0 );
            Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vCexes, i), p->nCexes );
        }
    }
    p->nCexes++;
}